

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

FeatureVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies
          (FeatureVector *__return_storage_ptr__,Feature feature)

{
  Feature *pFVar1;
  
  switch(feature) {
  case SubgroupAllEqualT:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)0x0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,2);
    pFVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr;
    pFVar1[0] = SubgroupBroadcast_First;
    pFVar1[1] = SubgroupAll_Any_AllEqualBool;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         2;
    break;
  case SubgroupElect:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)0x0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,3);
    pFVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr;
    pFVar1[0] = SubgroupBallotFindLSB_MSB;
    pFVar1[1] = SubgroupBallot;
    pFVar1[2] = SubgroupInvocationID;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         3;
    break;
  default:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)0x0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    break;
  case SubgroupInverseBallot_InclBitCount_ExclBitCout:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)0x0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,1);
    *(__return_storage_ptr__->
     super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         SubgroupMask;
    goto LAB_00299fc2;
  case SubgroupBallotBitCount:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)0x0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,1);
    *(__return_storage_ptr__->
     super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         SubgroupBallot;
LAB_00299fc2:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         1;
    break;
  case SubgroupArithmeticIAddReduce:
  case SubgroupArithmeticIAddInclusiveScan:
  case SubgroupArithmeticFAddReduce:
  case SubgroupArithmeticFAddInclusiveScan:
  case SubgroupArithmeticIMulReduce:
  case SubgroupArithmeticIMulInclusiveScan:
  case SubgroupArithmeticFMulReduce:
  case SubgroupArithmeticFMulInclusiveScan:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)0x0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,5);
    pFVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr;
    pFVar1[0] = SubgroupSize;
    pFVar1[1] = SubgroupBallot;
    pFVar1[2] = SubgroupBallotBitCount;
    pFVar1[3] = SubgroupMask;
    pFVar1[4] = SubgroupBallotBitExtract;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         5;
    break;
  case SubgroupArithmeticIAddExclusiveScan:
  case SubgroupArithmeticFAddExclusiveScan:
  case SubgroupArithmeticIMulExclusiveScan:
  case SubgroupArithmeticFMulExclusiveScan:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)0x0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,6);
    pFVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr;
    pFVar1[0] = SubgroupSize;
    pFVar1[1] = SubgroupBallot;
    pFVar1[2] = SubgroupBallotBitCount;
    pFVar1[3] = SubgroupMask;
    pFVar1[4] = SubgroupElect;
    pFVar1[5] = SubgroupBallotBitExtract;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         6;
  }
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureVector CompilerGLSL::ShaderSubgroupSupportHelper::
    get_feature_dependencies(Feature feature)
{
	switch (feature)
	{
	case SubgroupAllEqualT:
		return { SubgroupBroadcast_First, SubgroupAll_Any_AllEqualBool };
	case SubgroupElect:
		return { SubgroupBallotFindLSB_MSB, SubgroupBallot, SubgroupInvocationID };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return { SubgroupMask };
	case SubgroupBallotBitCount:
		return { SubgroupBallot };
	case SubgroupArithmeticIAddReduce:
	case SubgroupArithmeticIAddInclusiveScan:
	case SubgroupArithmeticFAddReduce:
	case SubgroupArithmeticFAddInclusiveScan:
	case SubgroupArithmeticIMulReduce:
	case SubgroupArithmeticIMulInclusiveScan:
	case SubgroupArithmeticFMulReduce:
	case SubgroupArithmeticFMulInclusiveScan:
		return { SubgroupSize, SubgroupBallot, SubgroupBallotBitCount, SubgroupMask, SubgroupBallotBitExtract };
	case SubgroupArithmeticIAddExclusiveScan:
	case SubgroupArithmeticFAddExclusiveScan:
	case SubgroupArithmeticIMulExclusiveScan:
	case SubgroupArithmeticFMulExclusiveScan:
		return { SubgroupSize, SubgroupBallot, SubgroupBallotBitCount,
			     SubgroupMask, SubgroupElect,  SubgroupBallotBitExtract };
	default:
		return {};
	}
}